

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_setTimeout(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  JSRuntime *rt;
  void *pvVar4;
  long *opaque;
  JSValueUnion JVar6;
  ulong uVar7;
  JSRefCountHeader *p;
  JSRefCountHeader *p_1;
  int64_t iVar8;
  JSValue JVar9;
  JSValue JVar10;
  int64_t delay;
  timespec ts;
  long local_48;
  timespec local_40;
  JSValueUnion JVar5;
  
  rt = JS_GetRuntime(ctx);
  pvVar4 = JS_GetRuntimeOpaque(rt);
  piVar1 = (int *)(argv->u).ptr;
  lVar2 = argv->tag;
  iVar3 = JS_IsFunction(ctx,*argv);
  if (iVar3 == 0) {
    JVar9 = JS_ThrowTypeError(ctx,"not a function");
    JVar6 = JVar9.u;
    JVar9.tag = JVar9.tag;
    JVar9.u.float64 = -NAN;
    JVar5 = JVar6;
  }
  else {
    iVar3 = JS_ToInt64(ctx,&local_48,argv[1]);
    if (iVar3 != 0) {
LAB_00112f43:
      JVar5.float64 = 0.0;
      uVar7 = 0;
      iVar8 = 6;
      goto LAB_0011304c;
    }
    JVar9 = JS_NewObjectClass(ctx,js_os_timer_class_id);
    JVar5 = JVar9.u;
    if ((uint)JVar9.tag != 6) {
      opaque = (long *)js_mallocz(ctx,0x30);
      if (opaque == (long *)0x0) {
        if ((0xfffffff4 < (uint)JVar9.tag) &&
           (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValue(ctx,JVar9);
        }
        goto LAB_00112f43;
      }
      *(undefined4 *)(opaque + 2) = 1;
      clock_gettime(1,&local_40);
      opaque[3] = local_40.tv_nsec / 1000000 + local_40.tv_sec * 1000 + local_48;
      if (0xfffffff4 < (uint)lVar2) {
        *piVar1 = *piVar1 + 1;
      }
      opaque[4] = (long)piVar1;
      opaque[5] = lVar2;
      lVar2 = *(long *)((long)pvVar4 + 0x20);
      *(long **)(lVar2 + 8) = opaque;
      *opaque = lVar2;
      opaque[1] = (long)pvVar4 + 0x20;
      *(long **)((long)pvVar4 + 0x20) = opaque;
      JS_SetOpaque(JVar9,opaque);
    }
    JVar6.float64 = -NAN;
  }
  iVar8 = JVar9.tag;
  uVar7 = (ulong)JVar9.u.ptr & (ulong)JVar6.ptr;
LAB_0011304c:
  JVar10.u.ptr = (void *)((ulong)JVar5.ptr & 0xffffffff | uVar7);
  JVar10.tag = iVar8;
  return JVar10;
}

Assistant:

static JSValue js_os_setTimeout(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    int64_t delay;
    JSValueConst func;
    JSOSTimer *th;
    JSValue obj;

    func = argv[0];
    if (!JS_IsFunction(ctx, func))
        return JS_ThrowTypeError(ctx, "not a function");
    if (JS_ToInt64(ctx, &delay, argv[1]))
        return JS_EXCEPTION;
    obj = JS_NewObjectClass(ctx, js_os_timer_class_id);
    if (JS_IsException(obj))
        return obj;
    th = js_mallocz(ctx, sizeof(*th));
    if (!th) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    th->has_object = TRUE;
    th->timeout = get_time_ms() + delay;
    th->func = JS_DupValue(ctx, func);
    list_add_tail(&th->link, &ts->os_timers);
    JS_SetOpaque(obj, th);
    return obj;
}